

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

void react_keypress(XKeyEvent *ev)

{
  bool bVar1;
  int iVar2;
  uint k;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  byte local_bd;
  keycode_t code;
  uint8_t mods;
  wchar_t kp;
  wchar_t mx;
  wchar_t mo;
  wchar_t ms;
  wchar_t mc;
  char buf [128];
  KeySym ks;
  metadpy *m;
  wchar_t ch;
  wchar_t n;
  XKeyEvent *ev_local;
  
  m._0_4_ = 0;
  bVar4 = (ev->state & 4) != 0;
  bVar5 = (ev->state & 1) != 0;
  bVar1 = false;
  local_bd = 0;
  if ((ev->state & Metadpy->alt_mask) != 0) {
    local_bd = 4;
  }
  bVar3 = 0;
  if ((ev->state & Metadpy->super_mask) != 0) {
    bVar3 = 8;
  }
  local_bd = local_bd | bVar3;
  iVar2 = XLookupString(ev,&ms,0x7d,buf + 0x78,0);
  *(undefined1 *)((long)&ms + (long)iVar2) = 0;
  if (((((ulong)buf._120_8_ < 0xffe1) || (0xffee < (ulong)buf._120_8_)) &&
      (((ulong)buf._120_8_ < 0xfe01 || (0xfe13 < (ulong)buf._120_8_)))) &&
     ((buf._120_8_ != 0xff7e && (buf._120_8_ != 0xff7f)))) {
    switch(buf._120_8_) {
    case 0xff08:
      m._0_4_ = 0x9f;
      break;
    case 0xff09:
      m._0_4_ = 0x9d;
      break;
    case 0xff0d:
      m._0_4_ = 0x9c;
      break;
    case 0xff13:
      m._0_4_ = 0x99;
      break;
    case 0xff1b:
      m._0_4_ = 0xe000;
      break;
    case 0xff50:
      m._0_4_ = 0x94;
      break;
    case 0xff51:
      m._0_4_ = 0x81;
      break;
    case 0xff52:
      m._0_4_ = 0x83;
      break;
    case 0xff53:
      m._0_4_ = 0x82;
      break;
    case 0xff54:
      m._0_4_ = 0x80;
      break;
    case 0xff55:
      m._0_4_ = 0x95;
      break;
    case 0xff56:
      m._0_4_ = 0x97;
      break;
    case 0xff57:
      m._0_4_ = 0x96;
      break;
    case 0xff63:
      m._0_4_ = 0x98;
      break;
    case 0xff6b:
      m._0_4_ = 0x9a;
      break;
    case 0xff8d:
      m._0_4_ = 0x9c;
      bVar1 = true;
      break;
    case 0xff95:
      m._0_4_ = 0x94;
      bVar1 = true;
      break;
    case 0xff96:
      m._0_4_ = 0x81;
      bVar1 = true;
      break;
    case 0xff97:
      m._0_4_ = 0x83;
      bVar1 = true;
      break;
    case 0xff98:
      m._0_4_ = 0x82;
      bVar1 = true;
      break;
    case 0xff99:
      m._0_4_ = 0x80;
      bVar1 = true;
      break;
    case 0xff9a:
      m._0_4_ = 0x95;
      bVar1 = true;
      break;
    case 0xff9b:
      m._0_4_ = 0x97;
      bVar1 = true;
      break;
    case 0xff9c:
      m._0_4_ = 0x96;
      bVar1 = true;
      break;
    case 0xff9d:
      m._0_4_ = 0x9b;
      bVar1 = true;
      break;
    case 0xff9e:
      m._0_4_ = 0x98;
      bVar1 = true;
      break;
    case 0xff9f:
      m._0_4_ = 0x9e;
      bVar1 = true;
      break;
    case 0xffaa:
      m._0_4_ = 0x2a;
      bVar1 = true;
      break;
    case 0xffab:
      m._0_4_ = 0x2b;
      bVar1 = true;
      break;
    case 0xffad:
      m._0_4_ = 0x2d;
      bVar1 = true;
      break;
    case 0xffae:
      m._0_4_ = 0x2e;
      bVar1 = true;
      break;
    case 0xffaf:
      m._0_4_ = 0x2f;
      bVar1 = true;
      break;
    case 0xffb0:
      m._0_4_ = 0x30;
      bVar1 = true;
      break;
    case 0xffb1:
      m._0_4_ = 0x31;
      bVar1 = true;
      break;
    case 0xffb2:
      m._0_4_ = 0x32;
      bVar1 = true;
      break;
    case 0xffb3:
      m._0_4_ = 0x33;
      bVar1 = true;
      break;
    case 0xffb4:
      m._0_4_ = 0x34;
      bVar1 = true;
      break;
    case 0xffb5:
      m._0_4_ = 0x35;
      bVar1 = true;
      break;
    case 0xffb6:
      m._0_4_ = 0x36;
      bVar1 = true;
      break;
    case 0xffb7:
      m._0_4_ = 0x37;
      bVar1 = true;
      break;
    case 0xffb8:
      m._0_4_ = 0x38;
      bVar1 = true;
      break;
    case 0xffb9:
      m._0_4_ = 0x39;
      bVar1 = true;
      break;
    case 0xffbd:
      m._0_4_ = 0x3d;
      bVar1 = true;
      break;
    case 0xffbe:
      m._0_4_ = 0x84;
      break;
    case 0xffbf:
      m._0_4_ = 0x85;
      break;
    case 0xffc0:
      m._0_4_ = 0x86;
      break;
    case 0xffc1:
      m._0_4_ = 0x87;
      break;
    case 0xffc2:
      m._0_4_ = 0x88;
      break;
    case 0xffc3:
      m._0_4_ = 0x89;
      break;
    case 0xffc4:
      m._0_4_ = 0x8a;
      break;
    case 0xffc5:
      m._0_4_ = 0x8b;
      break;
    case 0xffc6:
      m._0_4_ = 0x8c;
      break;
    case 0xffc7:
      m._0_4_ = 0x8d;
      break;
    case 0xffc8:
      m._0_4_ = 0x8e;
      break;
    case 0xffc9:
      m._0_4_ = 0x8f;
      break;
    case 0xffca:
      m._0_4_ = 0x90;
      break;
    case 0xffcb:
      m._0_4_ = 0x91;
      break;
    case 0xffcc:
      m._0_4_ = 0x92;
      break;
    case 0xffff:
      m._0_4_ = 0x9e;
    }
    if (bVar1) {
      local_bd = local_bd | 0x10;
    }
    if ((keycode_t)m == 0) {
      if ((iVar2 != 0) && ((uint)buf._120_8_ < 0xff00)) {
        k = (uint)(char)ms;
        if ((bVar4) && ((k == 0 || (0x1f < k)))) {
          local_bd = local_bd | 1;
        }
        if ((((bVar5) && ((k < 0x21 || (0x2f < k)))) && ((k < 0x3a || (0x60 < k)))) &&
           ((k < 0x7b || (0x7e < k)))) {
          local_bd = local_bd | 2;
        }
        Term_keypress(k,local_bd);
      }
    }
    else {
      if (bVar4) {
        local_bd = local_bd | 1;
      }
      if (bVar5) {
        local_bd = local_bd | 2;
      }
      Term_keypress((keycode_t)m,local_bd);
    }
  }
  return;
}

Assistant:

static void react_keypress(XKeyEvent *ev)
{
	int n, ch = 0;
	metadpy *m = Metadpy;

	KeySym ks;

	char buf[128];

	/* Extract "modifier flags" */
	int mc = (ev->state & ControlMask) ? true : false;
	int ms = (ev->state & ShiftMask) ? true : false;
	int mo = (ev->state & m->alt_mask) ? true : false;
	int mx = (ev->state & m->super_mask) ? true : false;
	int kp = false;

	uint8_t mods = (mo ? KC_MOD_ALT : 0) | (mx ? KC_MOD_META : 0);

	/* Check for "normal" keypresses */
	n = XLookupString(ev, buf, 125, &ks, NULL);
	buf[n] = '\0';

	/* Ignore modifier keys by themselves */
	if (IsModifierKey(ks)) return;

	switch (ks) {
		case XK_BackSpace: ch = KC_BACKSPACE; break;
		case XK_Tab: ch = KC_TAB; break;
		case XK_Return: ch = KC_ENTER; break;
		case XK_Escape: ch = ESCAPE; break;

		case XK_Delete: ch = KC_DELETE; break;
		case XK_Home: ch = KC_HOME; break;
		case XK_Left: ch = ARROW_LEFT; break;
		case XK_Up: ch = ARROW_UP; break;
		case XK_Right: ch = ARROW_RIGHT; break;
		case XK_Down: ch = ARROW_DOWN; break;
		case XK_Page_Up: ch = KC_PGUP; break;
		case XK_Page_Down: ch = KC_PGDOWN; break;
		case XK_End: ch = KC_END; break;
		case XK_Insert: ch = KC_INSERT; break;
		case XK_Pause: ch = KC_PAUSE; break;
		case XK_Break: ch = KC_BREAK; break;

		/* keypad */
		case XK_KP_0: ch = '0'; kp = true; break;
		case XK_KP_1: ch = '1'; kp = true; break;
		case XK_KP_2: ch = '2'; kp = true; break;
		case XK_KP_3: ch = '3'; kp = true; break;
		case XK_KP_4: ch = '4'; kp = true; break;
		case XK_KP_5: ch = '5'; kp = true; break;
		case XK_KP_6: ch = '6'; kp = true; break;
		case XK_KP_7: ch = '7'; kp = true; break;
		case XK_KP_8: ch = '8'; kp = true; break;
		case XK_KP_9: ch = '9'; kp = true; break;

		case XK_KP_Decimal: ch = '.'; kp = true; break;
		case XK_KP_Divide: ch = '/'; kp = true; break;
		case XK_KP_Multiply: ch = '*'; kp = true; break;
		case XK_KP_Subtract: ch = '-'; kp = true; break;
		case XK_KP_Add: ch = '+'; kp = true; break;
		case XK_KP_Enter: ch = KC_ENTER; kp = true; break;
		case XK_KP_Equal: ch = '='; kp = true; break;

		case XK_KP_Delete: ch = KC_DELETE; kp = true; break;
		case XK_KP_Home: ch = KC_HOME; kp = true; break;
		case XK_KP_Left: ch = ARROW_LEFT; kp = true; break;
		case XK_KP_Up: ch = ARROW_UP; kp = true; break;
		case XK_KP_Right: ch = ARROW_RIGHT; kp = true; break;
		case XK_KP_Down: ch = ARROW_DOWN; kp = true; break;
		case XK_KP_Page_Up: ch = KC_PGUP; kp = true; break;
		case XK_KP_Page_Down: ch = KC_PGDOWN; kp = true; break;
		case XK_KP_End: ch = KC_END; kp = true; break;
		case XK_KP_Insert: ch = KC_INSERT; kp = true; break;
		case XK_KP_Begin: ch = KC_BEGIN; kp = true; break;

		case XK_F1: ch = KC_F1; break;
		case XK_F2: ch = KC_F2; break;
		case XK_F3: ch = KC_F3; break;
		case XK_F4: ch = KC_F4; break;
		case XK_F5: ch = KC_F5; break;
		case XK_F6: ch = KC_F6; break;
		case XK_F7: ch = KC_F7; break;
		case XK_F8: ch = KC_F8; break;
		case XK_F9: ch = KC_F9; break;
		case XK_F10: ch = KC_F10; break;
		case XK_F11: ch = KC_F11; break;
		case XK_F12: ch = KC_F12; break;
		case XK_F13: ch = KC_F13; break;
		case XK_F14: ch = KC_F14; break;
		case XK_F15: ch = KC_F15; break;
	}

	if (kp) mods |= KC_MOD_KEYPAD;

	if (ch) {
		if (mc) mods |= KC_MOD_CONTROL;
		if (ms) mods |= KC_MOD_SHIFT;
		Term_keypress(ch, mods);
		return;
	} else if (n && !IsSpecialKey(ks)) {
		keycode_t code = buf[0];

		if (mc && MODS_INCLUDE_CONTROL(code)) mods |= KC_MOD_CONTROL;
		if (ms && MODS_INCLUDE_SHIFT(code)) mods |= KC_MOD_SHIFT;

		Term_keypress(code, mods);
	}
}